

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

void Gia_SimAbsSolve(Gia_SimAbsMan_t *p)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Wrd_t *pVVar5;
  word *pwVar6;
  word *pwVar7;
  int *piVar8;
  int *piVar9;
  int iVar10;
  uint uVar11;
  word *pwVar12;
  long lVar13;
  Vec_Int_t *pVVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  timespec ts;
  timespec local_50;
  long local_40;
  Vec_Wrd_t *local_38;
  
  iVar10 = clock_gettime(3,&local_50);
  if (iVar10 < 0) {
    lVar16 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  iVar10 = p->vPatPairs->nSize;
  uVar15 = iVar10 - (iVar10 >> 0x1f);
  iVar10 = (((int)uVar15 >> 7) + 1) - (uint)((uVar15 >> 1 & 0x3f) == 0);
  pVVar5 = p->vCoverTable;
  p->nWordsTable = iVar10;
  uVar23 = (long)iVar10 * ((long)p->nCands + 1);
  iVar10 = (int)uVar23;
  if (pVVar5->nCap < iVar10) {
    if (pVVar5->pArray == (word *)0x0) {
      pwVar12 = (word *)malloc(uVar23 * 8);
    }
    else {
      pwVar12 = (word *)realloc(pVVar5->pArray,uVar23 * 8);
    }
    pVVar5->pArray = pwVar12;
    if (pwVar12 == (word *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                    ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    pVVar5->nCap = iVar10;
  }
  if (0 < iVar10) {
    memset(pVVar5->pArray,0,(uVar23 & 0xffffffff) << 3);
  }
  pVVar5->nSize = iVar10;
  iVar10 = p->nWordsTable;
  uVar15 = p->nCands;
  uVar11 = uVar15 * iVar10;
  local_40 = lVar16;
  if (-1 < (int)uVar11) {
    iVar22 = p->vCoverTable->nSize;
    if ((int)uVar11 < iVar22) {
      pwVar6 = p->vCoverTable->pArray;
      pwVar12 = pwVar6 + uVar11;
      p->pTableTemp = pwVar12;
      if (0 < (int)uVar15) {
        pVVar5 = p->vSims;
        iVar19 = p->nWords;
        uVar23 = 0;
        do {
          lVar16 = uVar23 * (long)iVar19;
          if ((((lVar16 < 0) || (pVVar5->nSize <= lVar16)) ||
              (lVar13 = uVar23 * (long)iVar10, lVar13 < 0)) || (iVar22 <= lVar13))
          goto LAB_007cca42;
          iVar2 = p->vPatPairs->nSize;
          uVar17 = 0;
          if (1 < iVar2) {
            pwVar7 = pVVar5->pArray;
            piVar8 = p->vPatPairs->pArray;
            pVVar14 = p->vValues;
            uVar17 = 0;
            do {
              uVar11 = piVar8[uVar17];
              if (((int)uVar11 < 0) || (iVar3 = pVVar14->nSize, iVar3 <= (int)uVar11)) {
LAB_007cc9e5:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              piVar9 = pVVar14->pArray;
              if (piVar9[uVar11] != 0) {
                __assert_fail("Vec_IntEntry(p->vValues, iPat) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                              ,0x49f,"void Gia_SimAbsSolve(Gia_SimAbsMan_t *)");
              }
              uVar4 = piVar8[uVar17 + 1];
              if (((int)uVar4 < 0) || (iVar3 <= (int)uVar4)) goto LAB_007cc9e5;
              if (piVar9[uVar4] != 1) {
                __assert_fail("Vec_IntEntry(p->vValues, iPat2) == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                              ,0x4a0,"void Gia_SimAbsSolve(Gia_SimAbsMan_t *)");
              }
              if ((((uint)(pwVar7[lVar16 + (ulong)(uVar4 >> 6)] >> ((byte)uVar4 & 0x3f)) ^
                   (uint)(pwVar7[lVar16 + (ulong)(uVar11 >> 6)] >> ((byte)uVar11 & 0x3f))) & 1) != 0
                 ) {
                puVar1 = pwVar6 + lVar13 + (uVar17 >> 7 & 0x1ffffff);
                *puVar1 = *puVar1 ^ 1L << ((byte)((uVar17 & 0xffffffff) >> 1) & 0x3f);
              }
              uVar17 = uVar17 + 2;
            } while ((int)((uint)uVar17 | 1) < iVar2);
          }
          if ((int)uVar17 != iVar2) {
            __assert_fail("k == Vec_IntSize(p->vPatPairs)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                          ,0x4a4,"void Gia_SimAbsSolve(Gia_SimAbsMan_t *)");
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar15);
      }
      p->vResub->nSize = 0;
      if (0 < iVar10) {
        memset(pwVar12,0,(long)iVar10 << 3);
      }
      iVar10 = p->vPatPairs->nSize;
      if (1 < iVar10) {
        uVar15 = 0;
        do {
          pwVar12[uVar15 >> 6] = pwVar12[uVar15 >> 6] ^ 1L << ((byte)uVar15 & 0x3f);
          uVar15 = uVar15 + 1;
        } while (iVar10 / 2 != uVar15);
      }
      uVar15 = p->nWordsTable;
      do {
        if ((int)uVar15 < 1) {
LAB_007cc8c1:
          if (p->fVerbose != 0) {
            lVar13 = 0;
            printf("Solution %2d for covering problem [%5d x %5d]: ",(ulong)(uint)p->vResub->nSize,
                   (ulong)(uint)(p->vPatPairs->nSize / 2),(ulong)(uint)p->nCands);
            lVar16 = local_40;
            pVVar14 = p->vResub;
            if (0 < pVVar14->nSize) {
              lVar13 = 0;
              do {
                printf("%6d ",(ulong)(uint)pVVar14->pArray[lVar13]);
                lVar13 = lVar13 + 1;
                pVVar14 = p->vResub;
              } while (lVar13 < pVVar14->nSize);
            }
            if ((uint)lVar13 < 0xc) {
              iVar10 = (uint)lVar13 - 0xc;
              do {
                printf("       ");
                iVar10 = iVar10 + 1;
              } while (iVar10 != 0);
            }
            printf("   ");
            iVar22 = 3;
            iVar10 = clock_gettime(3,&local_50);
            if (iVar10 < 0) {
              lVar13 = -1;
            }
            else {
              lVar13 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
            }
            Abc_Print(iVar22,"%s =","Time");
            Abc_Print(iVar22,"%9.2f sec\n",(double)(lVar13 + lVar16) / 1000000.0);
          }
          return;
        }
        uVar17 = (ulong)uVar15;
        uVar23 = 0;
        while (p->pTableTemp[uVar23] == 0) {
          uVar23 = uVar23 + 1;
          if (uVar17 == uVar23) goto LAB_007cc8c1;
        }
        if ((long)p->nCands < 1) {
          iVar10 = -1;
        }
        else {
          local_38 = p->vCoverTable;
          iVar22 = -1;
          lVar16 = 0;
          uVar23 = 0;
          uVar18 = 0xffffffff;
          do {
            if (local_38->nSize <= (int)((int)uVar23 * uVar15)) goto LAB_007cca42;
            iVar19 = 0;
            if (0 < (int)uVar15) {
              uVar20 = 0;
              iVar19 = 0;
              do {
                uVar21 = *(ulong *)((long)local_38->pArray + uVar20 * 8 + lVar16) &
                         p->pTableTemp[uVar20];
                uVar21 = uVar21 - (uVar21 >> 1 & 0x5555555555555555);
                uVar21 = (uVar21 >> 2 & 0x3333333333333333) + (uVar21 & 0x3333333333333333);
                uVar21 = (uVar21 >> 4) + uVar21 & 0xf0f0f0f0f0f0f0f;
                uVar21 = (uVar21 >> 8) + uVar21;
                lVar13 = (uVar21 >> 0x10) + uVar21;
                iVar19 = iVar19 + ((int)((ulong)lVar13 >> 0x20) + (int)lVar13 & 0xffU);
                uVar20 = uVar20 + 1;
              } while (uVar17 != uVar20);
            }
            if (iVar22 < iVar19) {
              uVar18 = uVar23 & 0xffffffff;
            }
            iVar10 = (int)uVar18;
            if (iVar22 <= iVar19) {
              iVar22 = iVar19;
            }
            uVar23 = uVar23 + 1;
            lVar16 = lVar16 + uVar17 * 8;
          } while (uVar23 != (long)p->nCands);
        }
        Vec_IntPush(p->vResub,iVar10);
        uVar15 = p->nWordsTable;
        uVar11 = iVar10 * uVar15;
        if (((int)uVar11 < 0) || (p->vCoverTable->nSize <= (int)uVar11)) break;
        if (0 < (int)uVar15) {
          pwVar12 = p->vCoverTable->pArray;
          pwVar6 = p->pTableTemp;
          uVar23 = 0;
          do {
            pwVar6[uVar23] = pwVar6[uVar23] & ~pwVar12[uVar11 + uVar23];
            uVar23 = uVar23 + 1;
          } while (uVar15 != uVar23);
        }
        uVar15 = p->nWordsTable;
      } while( true );
    }
  }
LAB_007cca42:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

void Gia_SimAbsSolve( Gia_SimAbsMan_t * p )
{
    abctime clk = Abc_Clock();
    int i, k, iPat, iPat2;
/*
    Vec_Int_t * vSimPats = Vec_IntDup( p->vPatPairs );
    Vec_IntUniqify( vSimPats );
    printf( "Selected %d pattern pairs contain %d unique patterns.\n", Vec_IntSize(p->vPatPairs)/2, Vec_IntSize(vSimPats) );
    Vec_IntFree( vSimPats );
*/
    // set up the covering problem
    p->nWordsTable = Abc_Bit6WordNum( Vec_IntSize(p->vPatPairs)/2 );
    Vec_WrdFill( p->vCoverTable, p->nWordsTable * (p->nCands + 1), 0 );
    p->pTableTemp = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * p->nCands );
    for ( i = 0; i < p->nCands; i++ )
    {
        word * pSimCand  = Vec_WrdEntryP( p->vSims, p->nWords * i );
        word * pSimTable = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * i );
        //printf( "%4d : ", i );
        //Extra_PrintBinary( stdout, (word *)pSimCand, p->nCands );  printf( "\n" );
        Vec_IntForEachEntryDouble( p->vPatPairs, iPat, iPat2, k )
        {
            assert( Vec_IntEntry(p->vValues, iPat)  == 0 );
            assert( Vec_IntEntry(p->vValues, iPat2) == 1 );
            if ( Abc_TtGetBit(pSimCand, iPat) != Abc_TtGetBit(pSimCand, iPat2) )
                Abc_TtXorBit(pSimTable, k/2);
        }
        assert( k == Vec_IntSize(p->vPatPairs) );
    }

    if ( 0 )
    {
        printf( "                  " );
        for ( i = 0; i < p->nCands; i++ )
            printf( "%d", i % 10 );
        printf( "\n" );

        Vec_IntForEachEntryDouble( p->vPatPairs, iPat, iPat2, i )
        {
            printf( "%4d  ", i/2 );
            printf( "%4d  ", iPat );
            printf( "%4d  ", iPat2 );
            for ( k = 0; k < p->nCands; k++ )
            {
                word * pSimTable = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * k );
                printf( "%c", Abc_TtGetBit(pSimTable, i/2) ? '*' : ' ' );
            }
            printf( "\n" );
        }
    }

    //Gia_SimAbsCheckSolution(p);

    Vec_IntClear( p->vResub );
    Abc_TtClear( p->pTableTemp, p->nWordsTable );
    for ( i = 0; i < Vec_IntSize(p->vPatPairs)/2; i++ )
        Abc_TtXorBit( p->pTableTemp, i );

    while ( !Abc_TtIsConst0(p->pTableTemp, p->nWordsTable) )
    {
        word * pSimTable;
        int iArgMax = -1, CostThis, CostMax = -1;
        // compute the cost of each column
        for ( i = 0; i < p->nCands; i++ )
        {
            pSimTable = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * i );
            CostThis = Abc_TtCountOnesVecMask( pSimTable, p->pTableTemp, p->nWordsTable, 0 );
            if ( CostMax >= CostThis )
                continue;
            CostMax = CostThis;
            iArgMax = i;
        }
        // find the best column
        Vec_IntPush( p->vResub, iArgMax );
        // delete values of this column
        pSimTable = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * iArgMax );
        Abc_TtSharp( p->pTableTemp, p->pTableTemp, pSimTable, p->nWordsTable );
    }
    if ( p->fVerbose )
    {
        printf( "Solution %2d for covering problem [%5d x %5d]: ", Vec_IntSize(p->vResub), Vec_IntSize(p->vPatPairs)/2, p->nCands );
        Vec_IntForEachEntry( p->vResub, iPat, i )
            printf( "%6d ", iPat );
        for ( ; i < 12; i++ )
            printf( "       " );
        printf( "   " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
}